

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  exception exception;
  string exception_1;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_98 [8];
  GeneralizedSuffixTree suffix_tree;
  char **argv_local;
  int argc_local;
  
  suffix_tree._120_8_ = argv;
  if (argc < 3) {
    printf("Launch parameters: ./substrings [input_file] [output_file]");
  }
  else {
    SuffixTree::GeneralizedSuffixTree::GeneralizedSuffixTree((GeneralizedSuffixTree *)local_98);
    pcVar1 = *(char **)(suffix_tree._120_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar1,&local_c9);
    SuffixTree::GeneralizedSuffixTree::BuildSuffixTreeFromFile
              ((GeneralizedSuffixTree *)local_98,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pcVar1 = *(char **)(suffix_tree._120_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar1,&local_f1);
    SuffixTree::GeneralizedSuffixTree::DumpCommonStringsToFile
              ((GeneralizedSuffixTree *)local_98,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"gtree.dot",
               (allocator<char> *)(exception_1.field_2._M_local_buf + 0xf));
    SuffixTree::GeneralizedSuffixTree::DumpSuffixTreeToDotFile
              ((GeneralizedSuffixTree *)local_98,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)(exception_1.field_2._M_local_buf + 0xf));
    SuffixTree::GeneralizedSuffixTree::~GeneralizedSuffixTree((GeneralizedSuffixTree *)local_98);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 3)
	{
		printf ("Launch parameters: ./substrings [input_file] [output_file]");
		return 0;
	}
	try
    {
        SuffixTree::GeneralizedSuffixTree suffix_tree;
        suffix_tree.BuildSuffixTreeFromFile (argv[1]);
        suffix_tree.DumpCommonStringsToFile (argv[2]);
#ifndef NDEBUG
        suffix_tree.DumpSuffixTreeToDotFile ("gtree.dot");
#endif
    }
    catch (std::exception exception)
    {
        printf ("%s\n", exception.what());
        exit (EXIT_FAILURE);
    }
    catch (std::string exception)
    {
        printf ("%s\n", exception.c_str());
        exit (EXIT_FAILURE);
    }
    return 0;
}